

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
::Set_column(Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
             *this,Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
                   *column)

{
  Index IVar1;
  Field_operators *pFVar2;
  Entry_constructor *pEVar3;
  
  IVar1 = (column->super_Row_access_option).columnIndex_;
  (column->super_Row_access_option).columnIndex_ = 0;
  (this->super_Row_access_option).columnIndex_ = IVar1;
  (this->super_Row_access_option).rows_ = (column->super_Row_access_option).rows_;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->column_)._M_t._M_impl.super__Rb_tree_header,
             &(column->column_)._M_t._M_impl.super__Rb_tree_header);
  pFVar2 = column->operators_;
  column->operators_ = (Field_operators *)0x0;
  this->operators_ = pFVar2;
  pEVar3 = column->entryPool_;
  column->entryPool_ = (Entry_constructor *)0x0;
  this->entryPool_ = pEVar3;
  return;
}

Assistant:

inline Set_column<Master_matrix>::Set_column(Set_column&& column) noexcept
    : RA_opt(std::move(static_cast<RA_opt&>(column))),
      Dim_opt(std::move(static_cast<Dim_opt&>(column))),
      Chain_opt(std::move(static_cast<Chain_opt&>(column))),
      column_(std::move(column.column_)),
      operators_(std::exchange(column.operators_, nullptr)),
      entryPool_(std::exchange(column.entryPool_, nullptr))
{}